

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *pGVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer pcVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  size_t c;
  pointer puVar9;
  cmGraphEdge *ni;
  pointer pcVar10;
  bool bVar11;
  size_t head;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visited;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> emitted;
  size_t local_d0;
  ulong local_c8;
  size_t local_c0;
  pointer local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  cmComputeComponentGraph *local_a0;
  Graph *local_98;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_90;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  pGVar1 = &this->FinalGraph;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  local_98 = pGVar1;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_b0 = &this->ComponentHead;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_b0,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_a8 = &this->ComponentTail;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_a8,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  lVar7 = (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_start;
  bVar11 = lVar7 == 0;
  if (!bVar11) {
    local_b8 = (pointer)&ccg->TarjanComponents;
    uVar8 = (lVar7 >> 3) * -0x5555555555555555;
    local_c0 = 0xffffffffffffffff;
    local_c8 = uVar8 + (uVar8 == 0);
    c = 0;
    do {
      local_d0 = local_c0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar2 = (ccg->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = *(pointer *)
                &pcVar2[c].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar9 = *(pointer *)
                     ((long)&pcVar2[c].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8); puVar9 != puVar3; puVar9 = puVar9 + -1) {
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar6 = IntraComponent(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_b8,c,puVar9[-1],&local_d0,
                               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&local_60,
                               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&local_90);
        if (bVar6) {
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_90);
        }
        else {
          ComplainAboutBadComponent(this,ccg,c,true);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_90);
          if (!bVar6) {
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::~_Rb_tree(&local_60);
            return bVar11;
          }
        }
      }
      (local_b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[c] = local_d0;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_60);
      c = c + 1;
      bVar11 = uVar8 <= c;
    } while (c != local_c8);
  }
  pGVar1 = local_98;
  pvVar5 = local_b0;
  lVar7 = (long)(ccg->ComponentGraph).
                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ccg->ComponentGraph).
                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    local_c8 = lVar7 + (ulong)(lVar7 == 0);
    lVar7 = 0;
    local_a0 = ccg;
    do {
      pcVar4 = (local_a0->ComponentGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar10 = *(pointer *)
                 &pcVar4[lVar7].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      local_b8 = *(pointer *)
                  ((long)&pcVar4[lVar7].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                          super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      if (pcVar10 != local_b8) {
        local_c0 = (local_a8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar7];
        do {
          local_60._M_impl._0_8_ =
               (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar10->Dest];
          local_90._M_impl._0_1_ = pcVar10->Strong;
          local_d0 = CONCAT71(local_d0._1_7_,pcVar10->Cross);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start + local_c0),(unsigned_long *)&local_60,
                     (bool *)&local_90,(bool *)&local_d0,&pcVar10->Backtrace);
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 != local_b8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != local_c8);
  }
  return bVar11;
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<size_t> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  size_t nc = components.size();
  for (size_t c = 0; c < nc; ++c) {
    size_t head = cmComputeComponentGraph::INVALID_COMPONENT;
    std::set<size_t> emitted;
    NodeList const& nl = components[c];
    for (size_t ni : cmReverseRange(nl)) {
      std::set<size_t> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  size_t n = cgraph.size();
  for (size_t depender_component = 0; depender_component < n;
       ++depender_component) {
    size_t depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      size_t dependee_component = ni;
      size_t dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.IsCross(),
        ni.GetBacktrace());
    }
  }
  return true;
}